

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O0

void __thiscall luna::Closure::AddUpvalue(Closure *this,Upvalue *upvalue)

{
  value_type *in_RDI;
  vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_> *unaff_retaddr;
  
  std::vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void AddUpvalue(Upvalue *upvalue)
        { upvalues_.push_back(upvalue); }